

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O2

void __thiscall tst_XmlModelSerialiser::basicSaveLoadStream(tst_XmlModelSerialiser *this)

{
  QAbstractItemModel *a;
  QAbstractItemModel *b;
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined8 *puVar4;
  QXmlStreamReader readStream;
  QXmlStreamWriter writeStream;
  QTemporaryFile serialisedXmlStream;
  XmlModelSerialiser serialiser;
  QModelIndex local_50;
  QModelIndex local_38;
  
  iVar3 = qMetaTypeId<QAbstractItemModel_const*>();
  puVar4 = (undefined8 *)QTest::qData("sourceModel",iVar3);
  a = (QAbstractItemModel *)*puVar4;
  iVar3 = qMetaTypeId<QAbstractItemModel*>();
  puVar4 = (undefined8 *)QTest::qData("destinationModel",iVar3);
  b = (QAbstractItemModel *)*puVar4;
  XmlModelSerialiser::XmlModelSerialiser(&serialiser,a,(QObject *)0x0);
  AbstractModelSerialiser::addRoleToSave((int)&serialiser);
  QTemporaryFile::QTemporaryFile(&serialisedXmlStream);
  bVar1 = (bool)(**(code **)(_serialisedXmlStream + 0x68))(&serialisedXmlStream,3);
  cVar2 = QTest::qVerify(bVar1,"serialisedXmlStream.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                         ,0x36);
  if (cVar2 != '\0') {
    QXmlStreamWriter::QXmlStreamWriter(&writeStream,(QIODevice *)&serialisedXmlStream);
    bVar1 = (bool)XmlModelSerialiser::saveModel((QXmlStreamWriter *)&serialiser);
    cVar2 = QTest::qVerify(bVar1,"serialiser.saveModel(writeStream)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                           ,0x38);
    if (cVar2 != '\0') {
      bVar1 = (bool)QFileDevice::seek((longlong)&serialisedXmlStream);
      cVar2 = QTest::qVerify(bVar1,"serialisedXmlStream.seek(0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                             ,0x39);
      if (cVar2 != '\0') {
        QXmlStreamReader::QXmlStreamReader(&readStream,(QIODevice *)&serialisedXmlStream);
        AbstractModelSerialiser::setModel((QAbstractItemModel *)&serialiser);
        bVar1 = (bool)XmlModelSerialiser::loadModel((QXmlStreamReader *)&serialiser);
        cVar2 = QTest::qVerify(bVar1,"serialiser.loadModel(readStream)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                               ,0x3c);
        if (cVar2 != '\0') {
          QFileDevice::close();
          local_38.r = -1;
          local_38.c = -1;
          local_38.i = 0;
          local_38.m = (QAbstractItemModel *)0x0;
          local_50.r = -1;
          local_50.c = -1;
          local_50.i = 0;
          local_50.m = (QAbstractItemModel *)0x0;
          tst_SerialiserCommon::checkModelEqual
                    (&this->super_tst_SerialiserCommon,a,b,&local_38,&local_50,true);
          QObject::deleteLater();
        }
        QXmlStreamReader::~QXmlStreamReader(&readStream);
      }
    }
    QXmlStreamWriter::~QXmlStreamWriter(&writeStream);
  }
  QTemporaryFile::~QTemporaryFile(&serialisedXmlStream);
  XmlModelSerialiser::~XmlModelSerialiser(&serialiser);
  return;
}

Assistant:

void tst_XmlModelSerialiser::basicSaveLoadStream()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    XmlModelSerialiser serialiser(sourceModel, nullptr);
    serialiser.addRoleToSave(Qt::UserRole + 1);
    QTemporaryFile serialisedXmlStream;
    QVERIFY(serialisedXmlStream.open());
    QXmlStreamWriter writeStream(&serialisedXmlStream);
    QVERIFY(serialiser.saveModel(writeStream));
    QVERIFY(serialisedXmlStream.seek(0));
    QXmlStreamReader readStream(&serialisedXmlStream);
    serialiser.setModel(destinationModel);
    QVERIFY(serialiser.loadModel(readStream));
    serialisedXmlStream.close();
    checkModelEqual(sourceModel, destinationModel);
    destinationModel->deleteLater();
}